

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int json_next_token(JSParseState *s)

{
  JSToken *token;
  byte bVar1;
  JSRuntime *pJVar2;
  byte *pbVar3;
  size_t sVar4;
  int iVar5;
  JSAtom JVar6;
  uintptr_t sp;
  char *fmt;
  byte *pbVar7;
  uint uVar8;
  size_t len;
  bool bVar9;
  JSValue JVar10;
  byte local_d8 [8];
  char ident_buf [128];
  byte *local_48;
  char *buf;
  byte *local_38;
  uint8_t *p;
  
  if (&stack0xfffffffffffffff8 < (undefined1 *)s->ctx->rt->stack_limit) {
    js_parse_error(s,"stack overflow");
    return -1;
  }
  token = &s->token;
  free_token(s,token);
  local_38 = s->buf_ptr;
  s->last_ptr = local_38;
  s->last_line_num = (s->token).line_num;
LAB_0012e3a3:
  pbVar3 = local_38;
  iVar5 = s->line_num;
  (s->token).line_num = iVar5;
  (s->token).ptr = local_38;
  local_d8[0] = *local_38;
  switch(local_d8[0]) {
  case 0:
    goto switchD_0012e3c8_caseD_0;
  default:
    if (-1 < (char)local_d8[0]) goto LAB_0012e70f;
    fmt = "unexpected character";
LAB_0012e622:
    js_parse_error(s,fmt);
    goto LAB_0012e6c3;
  case 9:
  case 0x20:
    goto switchD_0012e3c8_caseD_9;
  case 10:
    goto switchD_0012e3c8_caseD_a;
  case 0xb:
  case 0xc:
    if (s->ext_json == 0) goto LAB_0012e70f;
switchD_0012e3c8_caseD_9:
    local_38 = local_38 + 1;
    goto LAB_0012e3a3;
  case 0xd:
    if (local_38[1] == 10) {
      local_38 = local_38 + 1;
    }
switchD_0012e3c8_caseD_a:
    local_38 = local_38 + 1;
    s->line_num = iVar5 + 1;
    goto LAB_0012e3a3;
  case 0x22:
    goto switchD_0012e3c8_caseD_22;
  case 0x24:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    pbVar7 = local_38 + 1;
    local_48 = local_d8;
    buf = (char *)0x80;
    bVar1 = local_38[1];
    uVar8 = (uint)(char)bVar1;
    len = 1;
    local_38 = pbVar7;
    if (((char)bVar1 < '\0') ||
       ((lre_id_continue_table_ascii[bVar1 >> 5] >> (uVar8 & 0x1f) & 1) == 0)) goto LAB_0012e5bd;
    sVar4 = 2;
    goto LAB_0012e556;
  case 0x27:
    if (s->ext_json == 0) goto LAB_0012e70f;
switchD_0012e3c8_caseD_22:
    iVar5 = js_parse_string(s,(uint)local_d8[0],1,local_38 + 1,token,&local_38);
    if (iVar5 != 0) goto LAB_0012e6c3;
    goto LAB_0012e60c;
  case 0x2b:
    if (s->ext_json != 0) goto switchD_0012e3c8_caseD_2d;
    goto LAB_0012e70f;
  case 0x2d:
switchD_0012e3c8_caseD_2d:
    if (local_38[1] - 0x3a < 0xfffffff6) goto LAB_0012e70f;
    break;
  case 0x2f:
    if (s->ext_json == 0) goto LAB_0012e70f;
    if (local_38[1] == 0x2f) goto LAB_0012e484;
    if (local_38[1] != 0x2a) goto LAB_0012e70f;
    local_38 = local_38 + 2;
LAB_0012e41d:
    bVar1 = *local_38;
    if (bVar1 < 0xd) {
      if (bVar1 == 0) {
        if (local_38 < s->buf_end) goto LAB_0012e43c;
        fmt = "unexpected end of comment";
        goto LAB_0012e622;
      }
LAB_0012e455:
      if (bVar1 == 10) {
        s->line_num = s->line_num + 1;
      }
      else {
LAB_0012e45f:
        if ((char)bVar1 < '\0') {
          iVar5 = unicode_from_utf8(local_38,6,&local_38);
          if (iVar5 == -1) {
            local_38 = local_38 + 1;
          }
          goto LAB_0012e41d;
        }
      }
    }
    else {
LAB_0012e43c:
      if (bVar1 != 0xd) {
        if (bVar1 != 0x2a) goto LAB_0012e45f;
        if (local_38[1] != 0x2f) goto LAB_0012e455;
        local_38 = local_38 + 2;
        goto LAB_0012e3a3;
      }
    }
    local_38 = local_38 + 1;
    goto LAB_0012e41d;
  case 0x30:
    if (0xfffffff5 < local_38[1] - 0x3a) goto LAB_0012e70f;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    break;
  }
  bVar9 = s->ext_json != 0;
  iVar5 = 10;
  if (bVar9) {
    iVar5 = 0;
  }
  JVar10 = js_atof(s->ctx,(char *)local_38,(char **)&local_38,iVar5,(uint)bVar9 << 2);
  iVar5 = 5;
  if ((int)JVar10.tag != 6) {
    (s->token).val = -0x80;
    (s->token).u.str.str = JVar10;
    iVar5 = 0;
  }
  if (iVar5 == 0) goto LAB_0012e60c;
  if (iVar5 != 5) {
    return JVar10.u._0_4_;
  }
  goto LAB_0012e6c3;
LAB_0012e484:
  local_38 = local_38 + 2;
  while ((((bVar1 = *local_38, bVar1 != 0 || (local_38 < s->buf_end)) && (bVar1 != 10)) &&
         (bVar1 != 0xd))) {
    if ((char)bVar1 < '\0') {
      uVar8 = unicode_from_utf8(local_38,6,&local_38);
      if ((uVar8 & 0xfffffffe) == 0x2028) break;
      if (uVar8 == 0xffffffff) {
        local_38 = local_38 + 1;
      }
    }
    else {
      local_38 = local_38 + 1;
    }
  }
  goto LAB_0012e3a3;
switchD_0012e3c8_caseD_0:
  if (local_38 < s->buf_end) {
LAB_0012e70f:
    token->val = (uint)local_d8[0];
    local_38 = local_38 + 1;
  }
  else {
    token->val = -0x56;
  }
  goto LAB_0012e60c;
  while( true ) {
    local_48[len - 1] = (byte)uVar8;
    bVar1 = pbVar3[len];
    uVar8 = (uint)(char)bVar1;
    if (((char)bVar1 < '\0') ||
       (sVar4 = len + 1, (lre_id_continue_table_ascii[bVar1 >> 5] >> (uVar8 & 0x1f) & 1) == 0))
    break;
LAB_0012e556:
    len = sVar4;
    if ((buf + -6 <= (char *)(len - 1)) &&
       (iVar5 = ident_realloc(s->ctx,(char **)&local_48,(size_t *)&buf,(char *)local_d8), iVar5 != 0
       )) {
      pbVar7 = pbVar3 + len;
      JVar6 = 0;
      goto LAB_0012e5d1;
    }
  }
  pbVar7 = pbVar3 + len;
LAB_0012e5bd:
  JVar6 = JS_NewAtomLen(s->ctx,(char *)local_48,len);
LAB_0012e5d1:
  if (local_48 != local_d8) {
    pJVar2 = s->ctx->rt;
    (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,local_48);
  }
  if (JVar6 == 0) {
LAB_0012e6c3:
    token->val = -0x58;
    return -1;
  }
  (s->token).u.ident.atom = JVar6;
  *(undefined8 *)((long)&(s->token).u.str.str.u + 4) = 0;
  (s->token).val = -0x7d;
  local_38 = pbVar7;
LAB_0012e60c:
  s->buf_ptr = local_38;
  return 0;
}

Assistant:

static __exception int json_next_token(JSParseState *s)
{
    const uint8_t *p;
    int c;
    JSAtom atom;
    
    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        return js_parse_error(s, "stack overflow");
    }
    
    free_token(s, &s->token);

    p = s->last_ptr = s->buf_ptr;
    s->last_line_num = s->token.line_num;
 redo:
    s->token.line_num = s->line_num;
    s->token.ptr = p;
    c = *p;
    switch(c) {
    case 0:
        if (p >= s->buf_end) {
            s->token.val = TOK_EOF;
        } else {
            goto def_token;
        }
        break;
    case '\'':
        if (!s->ext_json) {
            /* JSON does not accept single quoted strings */
            goto def_token;
        }
        /* fall through */
    case '\"':
        if (js_parse_string(s, c, TRUE, p + 1, &s->token, &p))
            goto fail;
        break;
    case '\r':  /* accept DOS and MAC newline sequences */
        if (p[1] == '\n') {
            p++;
        }
        /* fall thru */
    case '\n':
        p++;
        s->line_num++;
        goto redo;
    case '\f':
    case '\v':
        if (!s->ext_json) {
            /* JSONWhitespace does not match <VT>, nor <FF> */
            goto def_token;
        }
        /* fall through */
    case ' ':
    case '\t':
        p++;
        goto redo;
    case '/':
        if (!s->ext_json) {
            /* JSON does not accept comments */
            goto def_token;
        }
        if (p[1] == '*') {
            /* comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end) {
                    js_parse_error(s, "unexpected end of comment");
                    goto fail;
                }
                if (p[0] == '*' && p[1] == '/') {
                    p += 2;
                    break;
                }
                if (*p == '\n') {
                    s->line_num++;
                    p++;
                } else if (*p == '\r') {
                    p++;
                } else if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else if (p[1] == '/') {
            /* line comment */
            p += 2;
            for(;;) {
                if (*p == '\0' && p >= s->buf_end)
                    break;
                if (*p == '\r' || *p == '\n')
                    break;
                if (*p >= 0x80) {
                    c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
                    /* LS or PS are considered as line terminator */
                    if (c == CP_LS || c == CP_PS) {
                        break;
                    } else if (c == -1) {
                        p++; /* skip invalid UTF-8 */
                    }
                } else {
                    p++;
                }
            }
            goto redo;
        } else {
            goto def_token;
        }
        break;
    case 'a': case 'b': case 'c': case 'd':
    case 'e': case 'f': case 'g': case 'h':
    case 'i': case 'j': case 'k': case 'l':
    case 'm': case 'n': case 'o': case 'p':
    case 'q': case 'r': case 's': case 't':
    case 'u': case 'v': case 'w': case 'x':
    case 'y': case 'z': 
    case 'A': case 'B': case 'C': case 'D':
    case 'E': case 'F': case 'G': case 'H':
    case 'I': case 'J': case 'K': case 'L':
    case 'M': case 'N': case 'O': case 'P':
    case 'Q': case 'R': case 'S': case 'T':
    case 'U': case 'V': case 'W': case 'X':
    case 'Y': case 'Z': 
    case '_':
    case '$':
        /* identifier : only pure ascii characters are accepted */
        p++;
        atom = json_parse_ident(s, &p, c);
        if (atom == JS_ATOM_NULL)
            goto fail;
        s->token.u.ident.atom = atom;
        s->token.u.ident.has_escape = FALSE;
        s->token.u.ident.is_reserved = FALSE;
        s->token.val = TOK_IDENT;
        break;
    case '+':
        if (!s->ext_json || !is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '0':
        if (is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '-':
        if (!is_digit(p[1]))
            goto def_token;
        goto parse_number;
    case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8':
    case '9': 
        /* number */
    parse_number:
        {
            JSValue ret;
            int flags, radix;
            if (!s->ext_json) {
                flags = 0;
                radix = 10;
            } else {
                flags = ATOD_ACCEPT_BIN_OCT;
                radix = 0;
            }
            ret = js_atof(s->ctx, (const char *)p, (const char **)&p, radix,
                          flags);
            if (JS_IsException(ret))
                goto fail;
            s->token.val = TOK_NUMBER;
            s->token.u.num.val = ret;
        }
        break;
    default:
        if (c >= 128) {
            js_parse_error(s, "unexpected character");
            goto fail;
        }
    def_token:
        s->token.val = c;
        p++;
        break;
    }
    s->buf_ptr = p;

    //    dump_token(s, &s->token);
    return 0;

 fail:
    s->token.val = TOK_ERROR;
    return -1;
}